

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.c
# Opt level: O3

int json_pointer_result_get_recursive(json_object *obj,char *path,json_pointer_get_result *res)

{
  int iVar1;
  int iVar2;
  char *path_00;
  size_t sVar3;
  json_object *pjVar4;
  int *piVar5;
  size_t idx_00;
  char *__s;
  size_t idx;
  json_object *local_40;
  size_t local_38;
  
  local_38 = 0;
  local_40 = obj;
  if (*path == '/') {
    __s = path + 1;
    path_00 = strchr(__s,0x2f);
    if (path_00 != (char *)0x0) {
      *path_00 = '\0';
    }
    iVar1 = json_object_is_type(obj,json_type_array);
    if (iVar1 == 0) {
      string_replace_all_occurrences_with_char(__s,"~1",'/');
      string_replace_all_occurrences_with_char(__s,"~0",'~');
      iVar1 = json_object_object_get_ex(obj,__s,&local_40);
      idx_00 = 0;
      pjVar4 = local_40;
      if (iVar1 == 0) {
        piVar5 = __errno_location();
        *piVar5 = 2;
        goto LAB_00109e88;
      }
    }
    else {
      iVar1 = is_valid_index(__s,&local_38);
      idx_00 = local_38;
      if (iVar1 == 0) {
        return -1;
      }
      sVar3 = json_object_array_length(obj);
      if ((sVar3 <= idx_00) ||
         (pjVar4 = json_object_array_get_idx(obj,idx_00), pjVar4 == (json_object *)0x0)) {
        piVar5 = __errno_location();
        *piVar5 = 2;
        return -1;
      }
    }
    local_40 = pjVar4;
    if (path_00 == (char *)0x0) {
      iVar1 = 0;
      if (res != (json_pointer_get_result *)0x0) {
        res->parent = obj;
        res->obj = local_40;
        iVar2 = json_object_is_type(obj,json_type_array);
        if (iVar2 == 0) {
          res->key_in_parent = __s;
        }
        else {
          res->index_in_parent = (uint32_t)idx_00;
        }
      }
    }
    else {
      *path_00 = '/';
      iVar1 = json_pointer_result_get_recursive(local_40,path_00,res);
    }
  }
  else {
    piVar5 = __errno_location();
    *piVar5 = 0x16;
LAB_00109e88:
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int json_pointer_result_get_recursive(struct json_object *obj, char *path,
                                             struct json_pointer_get_result *res)
{
	struct json_object *parent_obj = obj;
	size_t idx = 0;
	char *endp;
	int rc;

	/* All paths (on each recursion level must have a leading '/' */
	if (path[0] != '/')
	{
		errno = EINVAL;
		return -1;
	}
	path++;

	endp = strchr(path, '/');
	if (endp)
		*endp = '\0';

	/* If we err-ed here, return here */
	if ((rc = json_pointer_get_single_path(obj, path, &obj, &idx)))
		return rc;

	if (endp)
	{
		/* Put the slash back, so that the sanity check passes on next recursion level */
		*endp = '/';
		return json_pointer_result_get_recursive(obj, endp, res);
	}

	/* We should be at the end of the recursion here */
	if (res) {
		res->parent = parent_obj;
		res->obj = obj;
		if (json_object_is_type(res->parent, json_type_array))
			res->index_in_parent = idx;
		else
			res->key_in_parent = path;
	}

	return 0;
}